

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O1

uint64_t aom_sum_sse_2d_i16_sse2(int16_t *src,int src_stride,int width,int height,int *sum)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  uint64_t uVar6;
  undefined1 (*pauVar7) [16];
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar12;
  __m128d ad;
  undefined1 auVar11 [16];
  int iVar13;
  int iVar15;
  int iVar16;
  int iVar17;
  __m128d ad_1;
  undefined1 auVar14 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  uint uVar21;
  uint uVar22;
  undefined1 auVar20 [16];
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  if ((width == 4) && (height == 4)) {
    uVar1 = *(undefined8 *)src;
    uVar2 = *(undefined8 *)(src + src_stride * 2);
    uVar3 = *(undefined8 *)(src + src_stride);
    auVar11._8_8_ = uVar3;
    auVar11._0_8_ = uVar1;
    uVar4 = *(undefined8 *)(src + src_stride * 3);
    auVar14._8_8_ = uVar4;
    auVar14._0_8_ = uVar2;
    auVar18._0_2_ = (short)uVar2 + (short)uVar1;
    auVar18._2_2_ = (short)((ulong)uVar2 >> 0x10) + (short)((ulong)uVar1 >> 0x10);
    auVar18._4_2_ = (short)((ulong)uVar2 >> 0x20) + (short)((ulong)uVar1 >> 0x20);
    auVar18._6_2_ = (short)((ulong)uVar2 >> 0x30) + (short)((ulong)uVar1 >> 0x30);
    auVar18._8_2_ = (short)uVar4 + (short)uVar3;
    auVar18._10_2_ = (short)((ulong)uVar4 >> 0x10) + (short)((ulong)uVar3 >> 0x10);
    auVar18._12_2_ = (short)((ulong)uVar4 >> 0x20) + (short)((ulong)uVar3 >> 0x20);
    auVar18._14_2_ = (short)((ulong)uVar4 >> 0x30) + (short)((ulong)uVar3 >> 0x30);
    auVar18 = pmaddwd(auVar18,_DAT_005154e0);
    *sum = auVar18._12_4_ + auVar18._4_4_ + auVar18._8_4_ + auVar18._0_4_;
    auVar11 = pmaddwd(auVar11,auVar11);
    auVar14 = pmaddwd(auVar14,auVar14);
    return (long)(auVar14._12_4_ + auVar11._12_4_ + auVar14._4_4_ + auVar11._4_4_ +
                 auVar14._8_4_ + auVar11._8_4_ + auVar14._0_4_ + auVar11._0_4_);
  }
  if ((width == 4) && ((height & 3U) == 0)) {
    uVar6 = aom_sum_sse_2d_i16_4xn_sse2(src,src_stride,height,sum);
    return uVar6;
  }
  if ((height & 3U) != 0 || (width & 7U) != 0) {
    uVar6 = aom_sum_sse_2d_i16_c(src,src_stride,width,height,sum);
    return uVar6;
  }
  iVar8 = 0;
  iVar13 = 0;
  iVar15 = 0;
  iVar16 = 0;
  iVar17 = 0;
  lVar10 = 0;
  lVar12 = 0;
  do {
    lVar9 = 0;
    uVar19 = 0;
    uVar21 = 0;
    uVar22 = 0;
    uVar23 = 0;
    pauVar7 = (undefined1 (*) [16])src;
    do {
      auVar11 = *pauVar7;
      auVar14 = *(undefined1 (*) [16])(*pauVar7 + (long)src_stride * 2);
      auVar18 = *(undefined1 (*) [16])(*pauVar7 + (long)(src_stride * 2) * 2);
      auVar24 = pmaddwd(auVar11,auVar11);
      auVar5 = *(undefined1 (*) [16])(*pauVar7 + (long)(src_stride * 3) * 2);
      auVar25 = pmaddwd(auVar14,auVar14);
      auVar26 = pmaddwd(auVar18,auVar18);
      auVar20 = pmaddwd(auVar5,auVar5);
      uVar19 = auVar20._0_4_ + auVar26._0_4_ + auVar25._0_4_ + auVar24._0_4_ + uVar19;
      uVar21 = auVar20._4_4_ + auVar26._4_4_ + auVar25._4_4_ + auVar24._4_4_ + uVar21;
      uVar22 = auVar20._8_4_ + auVar26._8_4_ + auVar25._8_4_ + auVar24._8_4_ + uVar22;
      uVar23 = auVar20._12_4_ + auVar26._12_4_ + auVar25._12_4_ + auVar24._12_4_ + uVar23;
      auVar20._0_2_ = auVar14._0_2_ + auVar11._0_2_ + auVar18._0_2_ + auVar5._0_2_;
      auVar20._2_2_ = auVar14._2_2_ + auVar11._2_2_ + auVar18._2_2_ + auVar5._2_2_;
      auVar20._4_2_ = auVar14._4_2_ + auVar11._4_2_ + auVar18._4_2_ + auVar5._4_2_;
      auVar20._6_2_ = auVar14._6_2_ + auVar11._6_2_ + auVar18._6_2_ + auVar5._6_2_;
      auVar20._8_2_ = auVar14._8_2_ + auVar11._8_2_ + auVar18._8_2_ + auVar5._8_2_;
      auVar20._10_2_ = auVar14._10_2_ + auVar11._10_2_ + auVar18._10_2_ + auVar5._10_2_;
      auVar20._12_2_ = auVar14._12_2_ + auVar11._12_2_ + auVar18._12_2_ + auVar5._12_2_;
      auVar20._14_2_ = auVar14._14_2_ + auVar11._14_2_ + auVar18._14_2_ + auVar5._14_2_;
      auVar11 = pmaddwd(auVar20,_DAT_005154e0);
      iVar13 = iVar13 + auVar11._0_4_;
      iVar15 = iVar15 + auVar11._4_4_;
      iVar16 = iVar16 + auVar11._8_4_;
      iVar17 = iVar17 + auVar11._12_4_;
      lVar9 = lVar9 + 8;
      pauVar7 = pauVar7 + 1;
    } while (lVar9 < width);
    lVar10 = lVar10 + (ulong)uVar22 + (ulong)uVar19;
    lVar12 = lVar12 + (ulong)uVar23 + (ulong)uVar21;
    iVar8 = iVar8 + 4;
    src = (int16_t *)(*(undefined1 (*) [16])src + (long)(src_stride * 4) * 2);
  } while (iVar8 < height);
  *sum = *sum + iVar17 + iVar15 + iVar16 + iVar13;
  return lVar12 + lVar10;
}

Assistant:

uint64_t aom_sum_sse_2d_i16_sse2(const int16_t *src, int src_stride, int width,
                                 int height, int *sum) {
  if (LIKELY(width == 4 && height == 4)) {
    return aom_sum_sse_2d_i16_4x4_sse2(src, src_stride, sum);
  } else if (LIKELY(width == 4 && (height & 3) == 0)) {
    return aom_sum_sse_2d_i16_4xn_sse2(src, src_stride, height, sum);
  } else if (LIKELY((width & 7) == 0 && (height & 3) == 0)) {
    // Generic case
    return aom_sum_sse_2d_i16_nxn_sse2(src, src_stride, width, height, sum);
  } else {
    return aom_sum_sse_2d_i16_c(src, src_stride, width, height, sum);
  }
}